

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_freeCCtx(ZSTD_CCtx *cctx)

{
  ZSTD_CCtx *cctx_local;
  
  if (cctx == (ZSTD_CCtx *)0x0) {
    cctx_local = (ZSTD_CCtx *)0x0;
  }
  else if (cctx->staticSize == 0) {
    ZSTD_freeCCtxContent(cctx);
    ZSTD_free(cctx,cctx->customMem);
    cctx_local = (ZSTD_CCtx *)0x0;
  }
  else {
    cctx_local = (ZSTD_CCtx *)0xffffffffffffffc0;
  }
  return (size_t)cctx_local;
}

Assistant:

size_t ZSTD_freeCCtx(ZSTD_CCtx* cctx)
{
    if (cctx==NULL) return 0;   /* support free on NULL */
    if (cctx->staticSize) return ERROR(memory_allocation);   /* not compatible with static CCtx */
    ZSTD_freeCCtxContent(cctx);
    ZSTD_free(cctx, cctx->customMem);
    return 0;
}